

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaCurrentBudgetData::RemoveAllocation
          (VmaCurrentBudgetData *this,uint32_t heapIndex,VkDeviceSize allocationSize)

{
  LOCK();
  this->m_AllocationBytes[heapIndex].super___atomic_base<unsigned_long>._M_i =
       this->m_AllocationBytes[heapIndex].super___atomic_base<unsigned_long>._M_i - allocationSize;
  UNLOCK();
  LOCK();
  this->m_AllocationCount[heapIndex].super___atomic_base<unsigned_int>._M_i =
       this->m_AllocationCount[heapIndex].super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
  LOCK();
  (this->m_OperationsSinceBudgetFetch).super___atomic_base<unsigned_int>._M_i =
       (this->m_OperationsSinceBudgetFetch).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void VmaCurrentBudgetData::RemoveAllocation(uint32_t heapIndex, VkDeviceSize allocationSize)
{
    VMA_ASSERT(m_AllocationBytes[heapIndex] >= allocationSize);
    m_AllocationBytes[heapIndex] -= allocationSize;
    VMA_ASSERT(m_AllocationCount[heapIndex] > 0);
    --m_AllocationCount[heapIndex];
#if VMA_MEMORY_BUDGET
    ++m_OperationsSinceBudgetFetch;
#endif
}